

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O0

uint32_t __thiscall
utf8iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator*(utf8iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this)

{
  byte *pbVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int local_38;
  uint local_34;
  int n;
  uint32_t c;
  byte local_21;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_20;
  uint8_t b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  utf8iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  _Stack_20._M_current = (this->_ptr)._M_current;
  p._M_current = (char *)this;
  _n = __gnu_cxx::
       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::operator++(&stack0xffffffffffffffe0,0);
  pbVar1 = (byte *)__gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&n);
  local_21 = *pbVar1;
  if (local_21 < 0xf0) {
    if (local_21 < 0xe0) {
      if (local_21 < 0xc0) {
        if (0x7f < local_21) {
          return 0;
        }
        return (uint)local_21;
      }
      local_34 = local_21 & 0x1f;
      local_38 = 1;
    }
    else {
      local_34 = local_21 & 0xf;
      local_38 = 2;
    }
  }
  else {
    local_34 = local_21 & 7;
    local_38 = 3;
  }
  while (local_38 != 0) {
    local_34 = local_34 << 6;
    local_38 = local_38 + -1;
    local_40 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(&stack0xffffffffffffffe0,0);
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
    local_34 = (int)*pcVar2 & 0x3fU | local_34;
  }
  return local_34;
}

Assistant:

uint32_t operator*() const
    {
        P p=_ptr;
        uint8_t b0= *p++;
        uint32_t c;
        int n;
        if (b0>=0xf0) {
            c= b0&7;
            n=3;
        }
        else if (b0>=0xe0) {
            c= b0&15;
            n=2;
        }
        else if (b0>=0xc0) {
            c= b0&31;
            n=1;
        }
        else if (b0>=0x80) {
            return 0;
        }
        else {
            return b0;
        }
        while (n--) {
            c <<= 6;
            c |= *p++ & 0x3f;
        }
        return c;
    }